

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O0

void TPZShapeHDivConstantBound<pzshape::TPZShapePoint>::Initialize
               (TPZVec<long> *ids,int connectorder,int sideorient,TPZShapeData *data)

{
  int *piVar1;
  long in_RCX;
  int in_EDX;
  int nsides;
  int ncorner;
  int *in_stack_00000028;
  TPZVec<int> *in_stack_00000030;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  
  TPZManVector<int,_20>::Resize((TPZManVector<int,_20> *)data,_nsides);
  piVar1 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2c70),0);
  *piVar1 = in_EDX;
  TPZManVector<int,_27>::Resize
            ((TPZManVector<int,_27> *)ids,CONCAT44(connectorder,sideorient),(int *)data);
  TPZVec<int>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)ids,
                    CONCAT44(connectorder,sideorient));
  pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           int connectorder, int sideorient,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
#ifdef PZDEBUG
    if(ids.size() != ncorner || connectorder < 0 || std::abs(sideorient) != 1)
    {
        DebugStop();
    }
#endif
    if(TSHAPE::Type() == ETriangle || TSHAPE::Type() == EOned) connectorder++;

    data.fSideOrient.Resize(1);
    data.fSideOrient[0] = sideorient;
    data.fH1ConnectOrders.Resize(nsides-ncorner, connectorder);
    data.fH1ConnectOrders.Fill(connectorder);

    if(TSHAPE::Dimension == 1)
    {
        TPZShapeH1<TSHAPE>::Initialize(ids,data.fH1ConnectOrders,data);
    } else if (TSHAPE::Dimension == 2){
        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = data.fH1ConnectOrders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids,locconorders,data);
    } else {
        DebugStop();
    }
}